

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

bool __thiscall inja::Parser::parse_statement(Parser *this,Template *tmpl,string_view path)

{
  Token *this_00;
  pointer *ppuVar1;
  const_pointer pcVar2;
  pointer pBVar3;
  uint *puVar4;
  iterator iVar5;
  undefined8 uVar6;
  size_type sVar7;
  char *first;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  string_view filename;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  Kind KVar15;
  ulong uVar16;
  uint *puVar17;
  long *plVar18;
  pointer puVar19;
  undefined8 *puVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  size_type *psVar22;
  size_type *psVar23;
  size_t sVar24;
  pointer pIVar25;
  size_type sVar26;
  string pathname;
  Template include_template;
  json json_name;
  Op local_121;
  string local_120;
  undefined1 local_100 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  const_pointer local_88;
  undefined8 local_80;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_40;
  
  if (((this->m_tok).kind == Id) && (uVar16 = (this->m_tok).text.size_, uVar16 != 0)) {
    this_00 = &this->m_tok;
    pcVar2 = (this->m_tok).text.data_;
    sVar24 = 2;
    if (uVar16 < 2) {
      sVar24 = uVar16;
    }
    iVar13 = bcmp(pcVar2,"if",sVar24);
    if ((uVar16 == 2) && (iVar13 == 0)) {
      if (this->m_have_peek_tok == true) {
        (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
        uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
        pcVar2 = (this->m_peek_tok).text.data_;
        this_00->kind = (this->m_peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar8;
        (this->m_tok).text.data_ = pcVar2;
        this->m_have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_100,&this->m_lexer);
        (this->m_tok).text.size_ = local_100._16_8_;
        *(undefined8 *)this_00 = local_100._0_8_;
        (this->m_tok).text.data_ = (const_pointer)CONCAT44(local_100._12_4_,local_100._8_4_);
      }
      bVar11 = parse_expression(this,tmpl);
      if (bVar11) {
        local_100._0_8_ =
             ((long)(tmpl->bytecodes).
                    super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(tmpl->bytecodes).
                    super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::
        emplace_back<unsigned_long>(&this->m_if_stack,(unsigned_long *)local_100);
        local_100[0] = 0x2b;
        std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
        emplace_back<inja::Bytecode::Op>(&tmpl->bytecodes,local_100);
        return true;
      }
    }
    else {
      sVar24 = 5;
      if (uVar16 < 5) {
        sVar24 = uVar16;
      }
      iVar13 = bcmp(pcVar2,"endif",sVar24);
      if ((uVar16 == 5) && (iVar13 == 0)) {
        pIVar25 = (this->m_if_stack).
                  super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((this->m_if_stack).
            super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
            super__Vector_impl_data._M_start == pIVar25) {
          local_100._0_8_ = local_100 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,"endif without matching if","");
          inja_throw((string *)local_100,&local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p);
          }
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_);
          }
          pIVar25 = (this->m_if_stack).
                    super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        if (this->m_have_peek_tok == true) {
          (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
          uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
          pcVar2 = (this->m_peek_tok).text.data_;
          this_00->kind = (this->m_peek_tok).kind;
          *(undefined4 *)&this_00->field_0x4 = uVar8;
          (this->m_tok).text.data_ = pcVar2;
          this->m_have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)local_100,&this->m_lexer);
          (this->m_tok).text.size_ = local_100._16_8_;
          *(undefined8 *)this_00 = local_100._0_8_;
          (this->m_tok).text.data_ = (const_pointer)CONCAT44(local_100._12_4_,local_100._8_4_);
        }
        uVar16 = (ulong)pIVar25[-1].prev_cond_jump;
        if (uVar16 != 0xffffffff) {
          pBVar3 = (tmpl->bytecodes).
                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(uint *)&pBVar3[uVar16].field_0x4 =
               *(uint *)&pBVar3[uVar16].field_0x4 & 0xc0000000 |
               (int)((ulong)((long)(tmpl->bytecodes).
                                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) >> 3)
               * -0x49249249 & 0x3fffffffU;
        }
        puVar4 = pIVar25[-1].uncond_jumps.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar17 = pIVar25[-1].uncond_jumps.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar17 != puVar4; puVar17 = puVar17 + 1) {
          pBVar3 = (tmpl->bytecodes).
                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(uint *)&pBVar3[*puVar17].field_0x4 =
               *(uint *)&pBVar3[*puVar17].field_0x4 & 0xc0000000 |
               (int)((ulong)((long)(tmpl->bytecodes).
                                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) >> 3)
               * -0x49249249 & 0x3fffffffU;
        }
        pIVar25 = (this->m_if_stack).
                  super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        (this->m_if_stack).
        super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
        super__Vector_impl_data._M_finish = pIVar25 + -1;
        puVar19 = pIVar25[-1].uncond_jumps.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (puVar19 != (pointer)0x0) {
          operator_delete(puVar19);
          return true;
        }
        return true;
      }
      sVar24 = 4;
      if (uVar16 < 4) {
        sVar24 = uVar16;
      }
      iVar13 = bcmp(pcVar2,"else",sVar24);
      if ((uVar16 != 4) || (iVar13 != 0)) {
        sVar24 = 3;
        if (uVar16 < 3) {
          sVar24 = uVar16;
        }
        iVar13 = bcmp(pcVar2,"for",sVar24);
        if ((uVar16 == 3) && (iVar13 == 0)) {
          if (this->m_have_peek_tok == true) {
            (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
            uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
            uVar9 = *(undefined4 *)&(this->m_peek_tok).text.data_;
            uVar10 = *(undefined4 *)((long)&(this->m_peek_tok).text.data_ + 4);
            this_00->kind = (this->m_peek_tok).kind;
            *(undefined4 *)&(this->m_tok).field_0x4 = uVar8;
            *(undefined4 *)&(this->m_tok).text.data_ = uVar9;
            *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = uVar10;
            this->m_have_peek_tok = false;
          }
          else {
            Lexer::scan((Token *)local_100,&this->m_lexer);
            (this->m_tok).text.size_ = local_100._16_8_;
            this_00->kind = local_100._0_4_;
            *(undefined4 *)&(this->m_tok).field_0x4 = local_100._4_4_;
            *(undefined4 *)&(this->m_tok).text.data_ = local_100._8_4_;
            *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = local_100._12_4_;
          }
          if (this_00->kind != Id) {
            local_100._0_8_ = local_100 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
            Token::describe_abi_cxx11_(&local_a8,this_00);
            std::operator+(&local_c8,"expected id, got \'",&local_a8);
            plVar18 = (long *)std::__cxx11::string::append((char *)&local_c8);
            psVar22 = (size_type *)(plVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar18 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar22) {
              local_120.field_2._M_allocated_capacity = *psVar22;
              local_120.field_2._8_8_ = plVar18[3];
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            }
            else {
              local_120.field_2._M_allocated_capacity = *psVar22;
              local_120._M_dataplus._M_p = (pointer)*plVar18;
            }
            local_120._M_string_length = plVar18[1];
            *plVar18 = (long)psVar22;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            inja_throw((string *)local_100,&local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
              operator_delete((void *)local_100._0_8_);
            }
          }
          uVar6 = *(undefined8 *)&this->m_tok;
          local_88 = (this->m_tok).text.data_;
          sVar26 = (this->m_tok).text.size_;
          if (this->m_have_peek_tok == true) {
            (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
            uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
            pcVar2 = (this->m_peek_tok).text.data_;
            this_00->kind = (this->m_peek_tok).kind;
            *(undefined4 *)&this_00->field_0x4 = uVar8;
            (this->m_tok).text.data_ = pcVar2;
            this->m_have_peek_tok = false;
          }
          else {
            Lexer::scan((Token *)local_100,&this->m_lexer);
            (this->m_tok).text.size_ = local_100._16_8_;
            *(undefined8 *)this_00 = local_100._0_8_;
            (this->m_tok).text.data_ = (const_pointer)CONCAT44(local_100._12_4_,local_100._8_4_);
          }
          local_80 = CONCAT44(local_80._4_4_,0x1a);
          local_78.data_ = (const_pointer)0x0;
          local_78.size_ = 0;
          KVar15 = this_00->kind;
          if (KVar15 == Comma) {
            if (this->m_have_peek_tok == true) {
              (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
              uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
              uVar9 = *(undefined4 *)&(this->m_peek_tok).text.data_;
              uVar10 = *(undefined4 *)((long)&(this->m_peek_tok).text.data_ + 4);
              this_00->kind = (this->m_peek_tok).kind;
              *(undefined4 *)&(this->m_tok).field_0x4 = uVar8;
              *(undefined4 *)&(this->m_tok).text.data_ = uVar9;
              *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = uVar10;
              this->m_have_peek_tok = false;
            }
            else {
              Lexer::scan((Token *)local_100,&this->m_lexer);
              (this->m_tok).text.size_ = local_100._16_8_;
              this_00->kind = local_100._0_4_;
              *(undefined4 *)&(this->m_tok).field_0x4 = local_100._4_4_;
              *(undefined4 *)&(this->m_tok).text.data_ = local_100._8_4_;
              *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = local_100._12_4_;
            }
            if (this_00->kind != Id) {
              local_100._0_8_ = local_100 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","")
              ;
              Token::describe_abi_cxx11_(&local_a8,this_00);
              std::operator+(&local_c8,"expected id, got \'",&local_a8);
              puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
              psVar22 = puVar20 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar20 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar22) {
                local_120.field_2._M_allocated_capacity = *psVar22;
                local_120.field_2._8_8_ = puVar20[3];
                local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              }
              else {
                local_120.field_2._M_allocated_capacity = *psVar22;
                local_120._M_dataplus._M_p = (pointer)*puVar20;
              }
              local_120._M_string_length = puVar20[1];
              *puVar20 = psVar22;
              puVar20[1] = 0;
              *(undefined1 *)(puVar20 + 2) = 0;
              inja_throw((string *)local_100,&local_120);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
                operator_delete((void *)local_100._0_8_);
              }
            }
            local_78.data_ = local_88;
            local_88 = (this->m_tok).text.data_;
            sVar7 = (this->m_tok).text.size_;
            local_80 = uVar6;
            local_78.size_ = sVar26;
            if (this->m_have_peek_tok == true) {
              (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
              uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
              uVar9 = *(undefined4 *)&(this->m_peek_tok).text.data_;
              uVar10 = *(undefined4 *)((long)&(this->m_peek_tok).text.data_ + 4);
              this_00->kind = (this->m_peek_tok).kind;
              *(undefined4 *)&(this->m_tok).field_0x4 = uVar8;
              *(undefined4 *)&(this->m_tok).text.data_ = uVar9;
              *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = uVar10;
              this->m_have_peek_tok = false;
            }
            else {
              Lexer::scan((Token *)local_100,&this->m_lexer);
              (this->m_tok).text.size_ = local_100._16_8_;
              this_00->kind = local_100._0_4_;
              *(undefined4 *)&(this->m_tok).field_0x4 = local_100._4_4_;
              *(undefined4 *)&(this->m_tok).text.data_ = local_100._8_4_;
              *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = local_100._12_4_;
            }
            KVar15 = this_00->kind;
            bVar11 = sVar26 == 0;
            sVar26 = sVar7;
          }
          else {
            bVar11 = true;
          }
          if (((KVar15 != Id) || ((this->m_tok).text.size_ != 2)) ||
             (*(short *)(this->m_tok).text.data_ != 0x6e69)) {
            local_100._0_8_ = local_100 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
            Token::describe_abi_cxx11_(&local_a8,this_00);
            plVar18 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x400452)
            ;
            psVar23 = (size_type *)(plVar18 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar18 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar23) {
              local_c8.field_2._M_allocated_capacity = *psVar23;
              local_c8.field_2._8_8_ = plVar18[3];
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar23;
              local_c8._M_dataplus._M_p = (pointer)*plVar18;
            }
            local_c8._M_string_length = plVar18[1];
            *plVar18 = (long)psVar23;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
            psVar22 = puVar20 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar20 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar22) {
              local_120.field_2._M_allocated_capacity = *psVar22;
              local_120.field_2._8_8_ = puVar20[3];
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            }
            else {
              local_120.field_2._M_allocated_capacity = *psVar22;
              local_120._M_dataplus._M_p = (pointer)*puVar20;
            }
            local_120._M_string_length = puVar20[1];
            *puVar20 = psVar22;
            puVar20[1] = 0;
            *(undefined1 *)(puVar20 + 2) = 0;
            inja_throw((string *)local_100,&local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
              operator_delete((void *)local_100._0_8_);
            }
          }
          if (this->m_have_peek_tok == true) {
            (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
            uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
            pcVar2 = (this->m_peek_tok).text.data_;
            this_00->kind = (this->m_peek_tok).kind;
            *(undefined4 *)&this_00->field_0x4 = uVar8;
            (this->m_tok).text.data_ = pcVar2;
            this->m_have_peek_tok = false;
          }
          else {
            Lexer::scan((Token *)local_100,&this->m_lexer);
            (this->m_tok).text.size_ = local_100._16_8_;
            *(undefined8 *)this_00 = local_100._0_8_;
            (this->m_tok).text.data_ = (const_pointer)CONCAT44(local_100._12_4_,local_100._8_4_);
          }
          bVar12 = parse_expression(this,tmpl);
          if (!bVar12) {
            return false;
          }
          uVar14 = (int)((ulong)((long)(tmpl->bytecodes).
                                       super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(tmpl->bytecodes).
                                      super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249
          ;
          local_100._0_4_ = uVar14;
          iVar5._M_current =
               (this->m_loop_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->m_loop_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&this->m_loop_stack,iVar5,(uint *)local_100);
          }
          else {
            *iVar5._M_current = uVar14;
            (this->m_loop_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          local_100[0] = 0x2c;
          std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
          emplace_back<inja::Bytecode::Op>(&tmpl->bytecodes,local_100);
          if (!bVar11) {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_&,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_0>
                      (&local_40,&local_78);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator=(&(tmpl->bytecodes).
                         super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl
                         .super__Vector_impl_data._M_finish[-1].value,&local_40);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_40);
          }
          local_100._0_8_ = local_100 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_100,local_88,local_88 + sVar26);
          std::__cxx11::string::operator=
                    ((string *)
                     &(tmpl->bytecodes).
                      super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].str,(string *)local_100);
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            operator_delete((void *)local_100._0_8_);
          }
        }
        else {
          sVar24 = 6;
          if (uVar16 < 6) {
            sVar24 = uVar16;
          }
          iVar13 = bcmp(pcVar2,"endfor",sVar24);
          if ((uVar16 == 6) && (iVar13 == 0)) {
            if (this->m_have_peek_tok == true) {
              (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
              uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
              uVar9 = *(undefined4 *)&(this->m_peek_tok).text.data_;
              uVar10 = *(undefined4 *)((long)&(this->m_peek_tok).text.data_ + 4);
              this_00->kind = (this->m_peek_tok).kind;
              *(undefined4 *)&(this->m_tok).field_0x4 = uVar8;
              *(undefined4 *)&(this->m_tok).text.data_ = uVar9;
              *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = uVar10;
              this->m_have_peek_tok = false;
            }
            else {
              Lexer::scan((Token *)local_100,&this->m_lexer);
              (this->m_tok).text.size_ = local_100._16_8_;
              this_00->kind = local_100._0_4_;
              *(undefined4 *)&(this->m_tok).field_0x4 = local_100._4_4_;
              *(undefined4 *)&(this->m_tok).text.data_ = local_100._8_4_;
              *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = local_100._12_4_;
            }
            puVar19 = (this->m_loop_stack).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if ((this->m_loop_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start == puVar19) {
              local_100._0_8_ = local_100 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","")
              ;
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_120,"endfor without matching for","");
              inja_throw((string *)local_100,&local_120);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p);
              }
              if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
                operator_delete((void *)local_100._0_8_);
              }
              puVar19 = (this->m_loop_stack).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            }
            pBVar3 = (tmpl->bytecodes).
                     super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(uint *)&pBVar3[puVar19[-1]].field_0x4 =
                 *(uint *)&pBVar3[puVar19[-1]].field_0x4 & 0xc0000000 |
                 (int)((ulong)((long)(tmpl->bytecodes).
                                     super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) >> 3
                      ) * -0x49249249 & 0x3fffffffU;
            local_100[0] = 0x2d;
            std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
            emplace_back<inja::Bytecode::Op>(&tmpl->bytecodes,local_100);
            pBVar3 = (tmpl->bytecodes).
                     super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            *(uint *)&pBVar3[-1].field_0x4 =
                 *(uint *)&pBVar3[-1].field_0x4 & 0xc0000000 |
                 (this->m_loop_stack).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1] + 1 & 0x3fffffff;
            ppuVar1 = &(this->m_loop_stack).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + -1;
          }
          else {
            sVar24 = 7;
            if (uVar16 < 7) {
              sVar24 = uVar16;
            }
            iVar13 = bcmp(pcVar2,"include",sVar24);
            if (uVar16 != 7) {
              return false;
            }
            if (iVar13 != 0) {
              return false;
            }
            if (this->m_have_peek_tok == true) {
              (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
              uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
              uVar9 = *(undefined4 *)&(this->m_peek_tok).text.data_;
              uVar10 = *(undefined4 *)((long)&(this->m_peek_tok).text.data_ + 4);
              this_00->kind = (this->m_peek_tok).kind;
              *(undefined4 *)&(this->m_tok).field_0x4 = uVar8;
              *(undefined4 *)&(this->m_tok).text.data_ = uVar9;
              *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = uVar10;
              this->m_have_peek_tok = false;
            }
            else {
              Lexer::scan((Token *)local_100,&this->m_lexer);
              (this->m_tok).text.size_ = local_100._16_8_;
              this_00->kind = local_100._0_4_;
              *(undefined4 *)&(this->m_tok).field_0x4 = local_100._4_4_;
              *(undefined4 *)&(this->m_tok).text.data_ = local_100._8_4_;
              *(undefined4 *)((long)&(this->m_tok).text.data_ + 4) = local_100._12_4_;
            }
            if (this_00->kind != String) {
              local_100._0_8_ = local_100 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","")
              ;
              Token::describe_abi_cxx11_(&local_a8,this_00);
              std::operator+(&local_c8,"expected string, got \'",&local_a8);
              puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
              psVar22 = puVar20 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar20 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar22) {
                local_120.field_2._M_allocated_capacity = *psVar22;
                local_120.field_2._8_8_ = puVar20[3];
                local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              }
              else {
                local_120.field_2._M_allocated_capacity = *psVar22;
                local_120._M_dataplus._M_p = (pointer)*puVar20;
              }
              local_120._M_string_length = puVar20[1];
              *puVar20 = psVar22;
              puVar20[1] = 0;
              *(undefined1 *)(puVar20 + 2) = 0;
              inja_throw((string *)local_100,&local_120);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
                operator_delete((void *)local_100._0_8_);
              }
            }
            first = (this->m_tok).text.data_;
            nlohmann::detail::input_adapter::input_adapter<const_char_*,_0>
                      ((input_adapter *)local_100,first,first + (this->m_tok).text.size_);
            local_58 = (code *)0x0;
            uStack_50 = 0;
            local_68._M_unused._M_object = (void *)0x0;
            local_68._8_8_ = 0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&local_a8,(input_adapter *)local_100,(parser_callback_t *)&local_68,true);
            if (local_58 != (code *)0x0) {
              (*local_58)(&local_68,&local_68,__destroy_functor);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(local_100._12_4_,local_100._8_4_) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(local_100._12_4_,local_100._8_4_));
            }
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_120,path.data_,path.data_ + path.size_);
            pbVar21 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      ::
                      get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)&local_a8);
            std::__cxx11::string::_M_append((char *)&local_120,(ulong)(pbVar21->_M_dataplus)._M_p);
            iVar13 = std::__cxx11::string::compare((ulong)&local_120,0,(char *)0x2);
            if (iVar13 == 0) {
              std::__cxx11::string::erase((ulong)&local_120,0);
            }
            filename.size_ = local_120._M_string_length;
            filename.data_ = local_120._M_dataplus._M_p;
            parse_template((Template *)local_100,this,filename);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
            ::_M_emplace_unique<std::__cxx11::string&,inja::Template&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,inja::Template>,std::_Select1st<std::pair<std::__cxx11::string_const,inja::Template>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,inja::Template>>>
                        *)this->m_included_templates,&local_120,(Template *)local_100);
            local_121 = Include;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_c8,&local_120);
            local_80 = CONCAT44(local_80._4_4_,1);
            std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
            emplace_back<inja::Bytecode::Op,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,inja::Bytecode::Flag>
                      ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)tmpl,&local_121,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_c8,(Flag *)&local_80);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)&local_c8);
            if (this->m_have_peek_tok == true) {
              (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
              uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
              pcVar2 = (this->m_peek_tok).text.data_;
              this_00->kind = (this->m_peek_tok).kind;
              *(undefined4 *)&this_00->field_0x4 = uVar8;
              (this->m_tok).text.data_ = pcVar2;
              this->m_have_peek_tok = false;
            }
            else {
              Lexer::scan((Token *)&local_c8,&this->m_lexer);
              (this->m_tok).text.size_ = local_c8.field_2._M_allocated_capacity;
              *(pointer *)this_00 = local_c8._M_dataplus._M_p;
              (this->m_tok).text.data_ = (const_pointer)local_c8._M_string_length;
            }
            Template::~Template((Template *)local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p);
            }
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)&local_a8);
          }
        }
        return true;
      }
      pIVar25 = (this->m_if_stack).
                super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((this->m_if_stack).
          super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
          super__Vector_impl_data._M_start == pIVar25) {
        local_100._0_8_ = local_100 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"parser_error","");
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_120,"else without matching if","");
        inja_throw((string *)local_100,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_);
        }
        pIVar25 = (this->m_if_stack).
                  super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      if (this->m_have_peek_tok == true) {
        (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
        uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
        pcVar2 = (this->m_peek_tok).text.data_;
        this_00->kind = (this->m_peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar8;
        (this->m_tok).text.data_ = pcVar2;
        this->m_have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_100,&this->m_lexer);
        (this->m_tok).text.size_ = local_100._16_8_;
        *(undefined8 *)this_00 = local_100._0_8_;
        (this->m_tok).text.data_ = (const_pointer)CONCAT44(local_100._12_4_,local_100._8_4_);
      }
      uVar14 = (int)((ulong)((long)(tmpl->bytecodes).
                                   super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(tmpl->bytecodes).
                                  super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
      local_100._0_4_ = uVar14;
      iVar5._M_current =
           pIVar25[-1].uncond_jumps.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          pIVar25[-1].uncond_jumps.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&pIVar25[-1].uncond_jumps,iVar5,(uint *)local_100);
      }
      else {
        *iVar5._M_current = uVar14;
        pIVar25[-1].uncond_jumps.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_100[0] = 0x2a;
      std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::emplace_back<inja::Bytecode::Op>
                (&tmpl->bytecodes,local_100);
      pBVar3 = (tmpl->bytecodes).super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(uint *)&pBVar3[pIVar25[-1].prev_cond_jump].field_0x4 =
           *(uint *)&pBVar3[pIVar25[-1].prev_cond_jump].field_0x4 & 0xc0000000 |
           (int)((ulong)((long)(tmpl->bytecodes).
                               super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) >> 3) *
           -0x49249249 & 0x3fffffffU;
      pIVar25[-1].prev_cond_jump = 0xffffffff;
      if (this_00->kind != Id) {
        return true;
      }
      uVar16 = (this->m_tok).text.size_;
      if (uVar16 == 0) {
        return true;
      }
      sVar24 = 2;
      if (uVar16 < 2) {
        sVar24 = uVar16;
      }
      iVar13 = bcmp((this->m_tok).text.data_,"if",sVar24);
      if (uVar16 != 2) {
        return true;
      }
      if (iVar13 != 0) {
        return true;
      }
      if (this->m_have_peek_tok == true) {
        (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
        uVar8 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
        pcVar2 = (this->m_peek_tok).text.data_;
        this_00->kind = (this->m_peek_tok).kind;
        *(undefined4 *)&this_00->field_0x4 = uVar8;
        (this->m_tok).text.data_ = pcVar2;
        this->m_have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_100,&this->m_lexer);
        (this->m_tok).text.size_ = local_100._16_8_;
        *(undefined8 *)this_00 = local_100._0_8_;
        (this->m_tok).text.data_ = (const_pointer)CONCAT44(local_100._12_4_,local_100._8_4_);
      }
      bVar11 = parse_expression(this,tmpl);
      if (bVar11) {
        pIVar25[-1].prev_cond_jump =
             (int)((ulong)((long)(tmpl->bytecodes).
                                 super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(tmpl->bytecodes).
                                super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
        local_100[0] = 0x2b;
        std::vector<inja::Bytecode,_std::allocator<inja::Bytecode>_>::
        emplace_back<inja::Bytecode::Op>(&tmpl->bytecodes,local_100);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool parse_statement(Template& tmpl, nonstd::string_view path) {
		if (m_tok.kind != Token::Kind::Id) return false;

		if (m_tok.text == "if") {
			get_next_token();

			// evaluate expression
			if (!parse_expression(tmpl)) return false;

			// start a new if block on if stack
			m_if_stack.emplace_back(tmpl.bytecodes.size());

			// conditional jump; destination will be filled in by else or endif
			tmpl.bytecodes.emplace_back(Bytecode::Op::ConditionalJump);
		} else if (m_tok.text == "endif") {
			if (m_if_stack.empty()) {
				inja_throw("parser_error", "endif without matching if");
			}
			auto& if_data = m_if_stack.back();
			get_next_token();

			// previous conditional jump jumps here
			if (if_data.prev_cond_jump != std::numeric_limits<unsigned int>::max()) {
				tmpl.bytecodes[if_data.prev_cond_jump].args = tmpl.bytecodes.size();
			}

			// update all previous unconditional jumps to here
			for (unsigned int i : if_data.uncond_jumps) {
				tmpl.bytecodes[i].args = tmpl.bytecodes.size();
			}

			// pop if stack
			m_if_stack.pop_back();
		} else if (m_tok.text == "else") {
			if (m_if_stack.empty()) inja_throw("parser_error", "else without matching if");
			auto& if_data = m_if_stack.back();
			get_next_token();

			// end previous block with unconditional jump to endif; destination will be
			// filled in by endif
			if_data.uncond_jumps.push_back(tmpl.bytecodes.size());
			tmpl.bytecodes.emplace_back(Bytecode::Op::Jump);

			// previous conditional jump jumps here
			tmpl.bytecodes[if_data.prev_cond_jump].args = tmpl.bytecodes.size();
			if_data.prev_cond_jump = std::numeric_limits<unsigned int>::max();

			// chained else if
			if (m_tok.kind == Token::Kind::Id && m_tok.text == "if") {
				get_next_token();

				// evaluate expression
				if (!parse_expression(tmpl)) return false;

				// update "previous jump"
				if_data.prev_cond_jump = tmpl.bytecodes.size();

				// conditional jump; destination will be filled in by else or endif
				tmpl.bytecodes.emplace_back(Bytecode::Op::ConditionalJump);
			}
		} else if (m_tok.text == "for") {
			get_next_token();

			// options: for a in arr; for a, b in obj
			if (m_tok.kind != Token::Kind::Id)
				inja_throw("parser_error", "expected id, got '" + m_tok.describe() + "'");
			Token value_token = m_tok;
			get_next_token();

			Token key_token;
			if (m_tok.kind == Token::Kind::Comma) {
				get_next_token();
				if (m_tok.kind != Token::Kind::Id)
					inja_throw("parser_error", "expected id, got '" + m_tok.describe() + "'");
				key_token = std::move(value_token);
				value_token = m_tok;
				get_next_token();
			}

			if (m_tok.kind != Token::Kind::Id || m_tok.text != "in")
				inja_throw("parser_error", "expected 'in', got '" + m_tok.describe() + "'");
			get_next_token();

			if (!parse_expression(tmpl)) return false;

			m_loop_stack.push_back(tmpl.bytecodes.size());

			tmpl.bytecodes.emplace_back(Bytecode::Op::StartLoop);
			if (!key_token.text.empty()) {
				tmpl.bytecodes.back().value = key_token.text;
			}
			tmpl.bytecodes.back().str = static_cast<std::string>(value_token.text);
		} else if (m_tok.text == "endfor") {
			get_next_token();
			if (m_loop_stack.empty()) {
				inja_throw("parser_error", "endfor without matching for");
			}

			// update loop with EndLoop index (for empty case)
			tmpl.bytecodes[m_loop_stack.back()].args = tmpl.bytecodes.size();

			tmpl.bytecodes.emplace_back(Bytecode::Op::EndLoop);
			tmpl.bytecodes.back().args = m_loop_stack.back() + 1;  // loop body
			m_loop_stack.pop_back();
		} else if (m_tok.text == "include") {
			get_next_token();

			if (m_tok.kind != Token::Kind::String) {
				inja_throw("parser_error", "expected string, got '" + m_tok.describe() + "'");
			}

			// build the relative path
			json json_name = json::parse(m_tok.text);
			std::string pathname = static_cast<std::string>(path);
			pathname += json_name.get_ref<const std::string&>();
			if (pathname.compare(0, 2, "./") == 0) {
				pathname.erase(0, 2);
			}
			// sys::path::remove_dots(pathname, true, sys::path::Style::posix);

			Template include_template = parse_template(pathname);
			m_included_templates.emplace(pathname, include_template);

			// generate a reference bytecode
			tmpl.bytecodes.emplace_back(Bytecode::Op::Include, json(pathname), Bytecode::Flag::ValueImmediate);

			get_next_token();
		} else {
			return false;
		}
		return true;
	}